

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_asm.cpp
# Opt level: O3

string * qpBasisStatusToString_abi_cxx11_
                   (string *__return_storage_ptr__,BasisStatus qp_basis_status)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(qp_basis_status) {
  case kInactive:
    pcVar2 = "Inactive";
    pcVar1 = "";
    break;
  case kActiveAtLower:
    pcVar2 = "Active at lower bound";
    pcVar1 = "";
    break;
  case kActiveAtUpper:
    pcVar2 = "Active at upper bound";
    pcVar1 = "";
    break;
  case kInactiveInBasis:
    pcVar2 = "Inactive in basis";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unidentified QP basis status";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string qpBasisStatusToString(const BasisStatus qp_basis_status) {
  switch (qp_basis_status) {
    case BasisStatus::kInactive:
      return "Inactive";
    case BasisStatus::kActiveAtLower:
      return "Active at lower bound";
    case BasisStatus::kActiveAtUpper:
      return "Active at upper bound";
    case BasisStatus::kInactiveInBasis:
      return "Inactive in basis";
    default:
      return "Unidentified QP basis status";
  }
}